

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

int __thiscall
notch::core::EuclideanLoss::clone
          (EuclideanLoss *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  EuclideanLoss *pEVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  __fn *p_Var5;
  void *__child_stack_00;
  EuclideanLoss *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  SharedBuffers local_38;
  
  local_48 = (EuclideanLoss *)0x0;
  p_Var5 = __fn;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<notch::core::EuclideanLoss,std::allocator<notch::core::EuclideanLoss>,notch::core::EuclideanLoss_const&>
            (&_Stack_40,&local_48,(allocator<notch::core::EuclideanLoss> *)&local_38,
             (EuclideanLoss *)__fn);
  SharedBuffers::clone(&local_38,__fn + 8,__child_stack_00,(int)p_Var5,__arg);
  _Var4._M_pi = local_38.inputBuffer.
                super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar3 = local_38.inputBuffer.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  pEVar2 = local_48;
  local_38.inputBuffer.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_38.inputBuffer.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (local_48->super_ALossLayer).shared.inputBuffer.
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (local_48->super_ALossLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (local_48->super_ALossLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  _Var4._M_pi = local_38.outputBuffer.
                super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar3 = local_38.outputBuffer.
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.outputBuffer.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_38.outputBuffer.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (pEVar2->super_ALossLayer).shared.outputBuffer.
           super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (pEVar2->super_ALossLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  (pEVar2->super_ALossLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (local_38.outputBuffer.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.outputBuffer.
               super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_38.inputBuffer.super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.inputBuffer.
               super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  (this->super_ALossLayer)._vptr_ALossLayer = (_func_int **)local_48;
  (this->super_ALossLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Stack_40._M_pi;
  return (int)this;
}

Assistant:

virtual std::shared_ptr<ALossLayer> clone() const {
        auto c = std::make_shared<EuclideanLoss>(*this);
        c->shared = shared.clone();
        return c;
    }